

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

void __thiscall kws::Parser::GenerateFixedFile(Parser *this)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  ostream *poVar5;
  string *in_RDI;
  ofstream file;
  string filename;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  string *in_stack_fffffffffffffd28;
  ostream local_2a8 [519];
  allocator local_a1;
  string local_a0 [32];
  string local_80 [55];
  allocator local_49;
  string local_48 [32];
  string local_28 [40];
  
  if ((in_RDI[0x31]._M_string_length & 1) != 0) {
    bVar1 = std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::empty
                      ((vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> *)
                       CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    if (bVar1) {
      poVar5 = std::operator<<((ostream *)&std::cout,"No error. Not generating corrected file.");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,pcVar4,&local_49);
      kwssys::SystemTools::GetFilenameWithoutExtension(in_stack_fffffffffffffd28);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
      std::__cxx11::string::operator+=(local_28,".fixed");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,pcVar4,&local_a1);
      kwssys::SystemTools::GetFilenameExtension(in_RDI);
      std::__cxx11::string::operator+=(local_28,local_80);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      poVar5 = std::operator<<((ostream *)&std::cout,"Generating corrected file: ");
      pcVar4 = (char *)std::__cxx11::string::c_str();
      poVar5 = std::operator<<(poVar5,pcVar4);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::ofstream::ofstream(local_2a8);
      _Var3 = std::__cxx11::string::c_str();
      std::operator|(_S_bin,_S_out);
      std::ofstream::open((char *)local_2a8,_Var3);
      bVar2 = std::ofstream::is_open();
      if ((bVar2 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Cannot open file for writing: ");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<(local_2a8,(string *)(in_RDI[0x29].field_2._M_local_buf + 8));
        std::ofstream::close();
      }
      std::ofstream::~ofstream(local_2a8);
      std::__cxx11::string::~string(local_28);
    }
  }
  return;
}

Assistant:

void Parser::GenerateFixedFile()
{
  if(!this->m_FixFile)
    {
    return;
    }

    if (m_ErrorList.empty()) {
      std::cout << "No error. Not generating corrected file." << std::endl;
      return;
    }

  std::string filename = kwssys::SystemTools::GetFilenameWithoutExtension(m_Filename.c_str());
  filename += ".fixed";
  filename += kwssys::SystemTools::GetFilenameExtension(m_Filename.c_str());

  std::cout << "Generating corrected file: " << filename.c_str() << std::endl;

  std::ofstream file;
  file.open(filename.c_str(), std::ios::binary | std::ios::out);
  if(!file.is_open())
    {
    std::cout << "Cannot open file for writing: " <<  std::endl;
    return;
    }

  file << this->m_FixedBuffer;

  file.close();
}